

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestCaseStart
          (PrettyUnitTestResultPrinter *this,TestCase *test_case)

{
  undefined8 uVar1;
  char *pcVar2;
  char *in_stack_00000008;
  char *in_stack_00000010;
  int in_stack_0000001c;
  string counts;
  TestSuite *in_stack_ffffffffffffff98;
  string local_30 [48];
  
  TestSuite::test_to_run_count((TestSuite *)0x188538);
  FormatCountableNoun_abi_cxx11_(in_stack_0000001c,in_stack_00000010,in_stack_00000008);
  ColoredPrintf(kGreen,"[----------] ");
  uVar1 = std::__cxx11::string::c_str();
  pcVar2 = TestSuite::name((TestSuite *)0x188580);
  printf("%s from %s",uVar1,pcVar2);
  pcVar2 = TestSuite::type_param(in_stack_ffffffffffffff98);
  if (pcVar2 == (char *)0x0) {
    printf("\n");
  }
  else {
    pcVar2 = TestSuite::type_param(in_stack_ffffffffffffff98);
    printf(", where %s = %s\n","TypeParam",pcVar2);
  }
  fflush(_stdout);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestCaseStart(const TestCase& test_case) {
  const std::string counts =
      FormatCountableNoun(test_case.test_to_run_count(), "test", "tests");
  ColoredPrintf(GTestColor::kGreen, "[----------] ");
  printf("%s from %s", counts.c_str(), test_case.name());
  if (test_case.type_param() == nullptr) {
    printf("\n");
  } else {
    printf(", where %s = %s\n", kTypeParamLabel, test_case.type_param());
  }
  fflush(stdout);
}